

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O2

bool __thiscall cmFileCopier::Install(cmFileCopier *this,string *fromFile,string *toFile)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  undefined1 uVar3;
  int iVar4;
  MatchProperties match_properties;
  string newFromFile;
  string newToFile;
  string sStack_68;
  string local_48;
  
  if (fromFile->_M_string_length == 0) {
    pcVar1 = this->Status;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sStack_68,"INSTALL encountered an empty string input file name.",
               (allocator<char> *)&local_48);
    std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
    std::__cxx11::string::~string((string *)&sStack_68);
    uVar3 = 0;
  }
  else {
    match_properties = CollectMatchProperties(this,fromFile);
    uVar3 = 1;
    if ((((ulong)match_properties & 1) == 0) &&
       (bVar2 = cmsys::SystemTools::SameFile(fromFile,toFile), !bVar2)) {
      std::__cxx11::string::string((string *)&sStack_68,(string *)fromFile);
      std::__cxx11::string::string((string *)&local_48,(string *)toFile);
      if ((this->FollowSymlinkChain != true) ||
         (bVar2 = InstallSymlinkChain(this,&sStack_68,&local_48), bVar2)) {
        bVar2 = cmsys::SystemTools::FileIsSymlink(&sStack_68);
        if (bVar2) {
          uVar3 = InstallSymlink(this,&sStack_68,&local_48);
        }
        else {
          bVar2 = cmsys::SystemTools::FileIsDirectory(&sStack_68);
          if (bVar2) {
            uVar3 = InstallDirectory(this,&sStack_68,&local_48,match_properties);
          }
          else {
            bVar2 = cmsys::SystemTools::FileExists(&sStack_68);
            if (bVar2) {
              iVar4 = (*this->_vptr_cmFileCopier[2])(this,&sStack_68,&local_48,match_properties);
              uVar3 = (undefined1)iVar4;
            }
            else {
              iVar4 = (*this->_vptr_cmFileCopier[6])(this,&sStack_68);
              uVar3 = (undefined1)iVar4;
            }
          }
        }
      }
      else {
        uVar3 = 0;
      }
      std::__cxx11::string::~string((string *)&local_48);
      std::__cxx11::string::~string((string *)&sStack_68);
    }
  }
  return (bool)uVar3;
}

Assistant:

bool cmFileCopier::Install(const std::string& fromFile,
                           const std::string& toFile)
{
  if (fromFile.empty()) {
    this->Status.SetError(
      "INSTALL encountered an empty string input file name.");
    return false;
  }

  // Collect any properties matching this file name.
  MatchProperties match_properties = this->CollectMatchProperties(fromFile);

  // Skip the file if it is excluded.
  if (match_properties.Exclude) {
    return true;
  }

  if (cmSystemTools::SameFile(fromFile, toFile)) {
    return true;
  }

  std::string newFromFile = fromFile;
  std::string newToFile = toFile;

  if (this->FollowSymlinkChain &&
      !this->InstallSymlinkChain(newFromFile, newToFile)) {
    return false;
  }

  if (cmSystemTools::FileIsSymlink(newFromFile)) {
    return this->InstallSymlink(newFromFile, newToFile);
  }
  if (cmSystemTools::FileIsDirectory(newFromFile)) {
    return this->InstallDirectory(newFromFile, newToFile, match_properties);
  }
  if (cmSystemTools::FileExists(newFromFile)) {
    return this->InstallFile(newFromFile, newToFile, match_properties);
  }
  return this->ReportMissing(newFromFile);
}